

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ScaleLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scale(NeuralNetworkLayer *this)

{
  bool bVar1;
  ScaleLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_scale(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_scale(this);
    this_00 = (ScaleLayerParams *)operator_new(0x58);
    ScaleLayerParams::ScaleLayerParams(this_00);
    (this->layer_).scale_ = this_00;
  }
  return (ScaleLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ScaleLayerParams* NeuralNetworkLayer::mutable_scale() {
  if (!has_scale()) {
    clear_layer();
    set_has_scale();
    layer_.scale_ = new ::CoreML::Specification::ScaleLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scale)
  return layer_.scale_;
}